

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

char * sentencepiece::logging::BaseName(char *path)

{
  char *pcVar1;
  char *p;
  char *path_local;
  
  pcVar1 = strrchr(path,0x2f);
  path_local = path;
  if (pcVar1 != (char *)0x0) {
    path_local = pcVar1 + 1;
  }
  return path_local;
}

Assistant:

inline const char *BaseName(const char *path) {
#ifdef OS_WIN
  const char *p = strrchr(path, '\\');
#else
  const char *p = strrchr(path, '/');
#endif
  if (p == nullptr) return path;
  return p + 1;
}